

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

void Fossilize::Instance::braceForComputePipelineCrash
               (StateRecorder *recorder,VkComputePipelineCreateInfo *info)

{
  long lVar1;
  
  lVar1 = __tls_get_addr(&PTR_00176fb0);
  *(StateRecorder **)(lVar1 + 8) = recorder;
  *(VkComputePipelineCreateInfo **)(lVar1 + 0x18) = info;
  *(undefined8 *)(lVar1 + 0x10) = 0;
  *(undefined8 *)(lVar1 + 0x20) = 0;
  return;
}

Assistant:

void Instance::braceForComputePipelineCrash(StateRecorder *recorder,
                                            const VkComputePipelineCreateInfo *info)
{
#ifdef FOSSILIZE_LAYER_CAPTURE_SIGSEGV
	tls_recorder = recorder;
	tls_compute_create_info = info;
	tls_graphics_create_info = nullptr;
	tls_raytracing_create_info = nullptr;
#else
	(void)recorder;
	(void)info;
#endif
}